

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall minja::VariableExpr::~VariableExpr(VariableExpr *this)

{
  VariableExpr *in_RDI;
  
  ~VariableExpr(in_RDI);
  operator_delete(in_RDI,0x40);
  return;
}

Assistant:

VariableExpr(const Location & location, const std::string& n)
      : Expression(location), name(n) {}